

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void ypr_substmt(lys_ypr_ctx_conflict *pctx,ly_stmt substmt,uint8_t substmt_index,char *text,
                void *exts)

{
  lys_ypr_ctx_conflict *plVar1;
  byte bVar2;
  char *pcVar3;
  char *attr_name;
  int8_t local_29;
  lysp_ext_instance *plStack_28;
  int8_t extflag;
  void *exts_local;
  char *text_local;
  uint8_t substmt_index_local;
  lys_ypr_ctx_conflict *plStack_10;
  ly_stmt substmt_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  local_29 = '\0';
  if (text != (char *)0x0) {
    plStack_28 = (lysp_ext_instance *)exts;
    exts_local = text;
    text_local._3_1_ = substmt_index;
    text_local._4_4_ = substmt;
    plStack_10 = pctx;
    bVar2 = lys_stmt_flags(substmt);
    plVar1 = plStack_10;
    if ((bVar2 & 1) == 0) {
      pcVar3 = lys_stmt_str(text_local._4_4_);
      attr_name = lys_stmt_arg(text_local._4_4_);
      ypr_open(plVar1,pcVar3,attr_name,(char *)exts_local,local_29);
    }
    else {
      local_29 = '\x01';
      pcVar3 = lys_stmt_str(text_local._4_4_);
      ypr_open(plVar1,pcVar3,(char *)0x0,(char *)0x0,local_29);
    }
    (plStack_10->field_0).field_0.level = (plStack_10->field_0).field_0.level + 1;
    yprp_extension_instances(plStack_10,text_local._4_4_,text_local._3_1_,plStack_28,&local_29);
    bVar2 = lys_stmt_flags(text_local._4_4_);
    plVar1 = plStack_10;
    if ((bVar2 & 1) != 0) {
      pcVar3 = lys_stmt_arg(text_local._4_4_);
      ypr_yin_arg(plVar1,pcVar3,(char *)exts_local);
    }
    plVar1 = plStack_10;
    (plStack_10->field_0).field_0.level = (plStack_10->field_0).field_0.level - 1;
    pcVar3 = lys_stmt_str(text_local._4_4_);
    ypr_close(plVar1,pcVar3,local_29);
  }
  return;
}

Assistant:

static void
ypr_substmt(struct lys_ypr_ctx *pctx, enum ly_stmt substmt, uint8_t substmt_index, const char *text, void *exts)
{
    int8_t extflag = 0;

    if (!text) {
        /* nothing to print */
        return;
    }

    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        extflag = 1;
        ypr_open(pctx, lys_stmt_str(substmt), NULL, NULL, extflag);
    } else {
        ypr_open(pctx, lys_stmt_str(substmt), lys_stmt_arg(substmt), text, extflag);
    }

    LEVEL++;
    yprp_extension_instances(pctx, substmt, substmt_index, exts, &extflag);

    /* argument as yin-element */
    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        ypr_yin_arg(pctx, lys_stmt_arg(substmt), text);
    }

    LEVEL--;
    ypr_close(pctx, lys_stmt_str(substmt), extflag);
}